

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configfile.cpp
# Opt level: O1

FConfigEntry * __thiscall
FConfigFile::NewConfigEntry(FConfigFile *this,FConfigSection *section,char *key,char *value)

{
  size_t __n;
  FConfigEntry *this_00;
  
  __n = strlen(key);
  this_00 = (FConfigEntry *)operator_new__(__n + 0x28);
  this_00->Value = (char *)0x0;
  this_00->Next = (FConfigEntry *)0x0;
  memcpy(this_00->Key,key,__n);
  this_00->Key[__n] = '\0';
  *section->LastEntryPtr = this_00;
  section->LastEntryPtr = &this_00->Next;
  FConfigEntry::SetValue(this_00,value);
  return this_00;
}

Assistant:

FConfigFile::FConfigEntry *FConfigFile::NewConfigEntry (
	FConfigFile::FConfigSection *section, const char *key, const char *value)
{
	FConfigEntry *entry;
	size_t keylen;

	keylen = strlen (key);
	entry = (FConfigEntry *)new char[sizeof(*section)+keylen];
	entry->Value = NULL;
	entry->Next = NULL;
	memcpy (entry->Key, key, keylen);
	entry->Key[keylen] = 0;
	*(section->LastEntryPtr) = entry;
	section->LastEntryPtr = &entry->Next;
	entry->SetValue (value);
	return entry;
}